

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O0

void SectionHdrWrapper::initSecCharacter
               (map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
                *secHdrCharact)

{
  mapped_type *pmVar1;
  key_type_conflict2 local_3c [11];
  map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
  *local_10;
  map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
  *secHdrCharact_local;
  
  local_3c[10] = 0x40000000;
  local_10 = secHdrCharact;
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,local_3c + 10);
  QString::operator=(pmVar1,"readable");
  local_3c[9] = 0x80000000;
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](local_10,local_3c + 9);
  QString::operator=(pmVar1,"writeable");
  local_3c[8] = 0x20000000;
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](local_10,local_3c + 8);
  QString::operator=(pmVar1,"executable");
  local_3c[7] = 0x1000000;
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](local_10,local_3c + 7);
  QString::operator=(pmVar1,"contains extended relocations");
  local_3c[6] = 0x2000000;
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](local_10,local_3c + 6);
  QString::operator=(pmVar1,"discardable");
  local_3c[5] = 0x4000000;
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](local_10,local_3c + 5);
  QString::operator=(pmVar1,"not cachable");
  local_3c[4] = 0x8000000;
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](local_10,local_3c + 4);
  QString::operator=(pmVar1,"non-pageable");
  local_3c[3] = 0x10000000;
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](local_10,local_3c + 3);
  QString::operator=(pmVar1,"shareable");
  local_3c[2] = 0x20;
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](local_10,local_3c + 2);
  QString::operator=(pmVar1,"code");
  local_3c[1] = 0x40;
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](local_10,local_3c + 1);
  QString::operator=(pmVar1,"initialized data");
  local_3c[0] = 0x80;
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](local_10,local_3c);
  QString::operator=(pmVar1,"uninitialized data");
  return;
}

Assistant:

void SectionHdrWrapper::initSecCharacter(std::map<DWORD, QString> &secHdrCharact)
{
    secHdrCharact[SCN_MEM_READ] = "readable";
    secHdrCharact[SCN_MEM_WRITE] = "writeable";
    secHdrCharact[SCN_MEM_EXECUTE] = "executable";

    secHdrCharact[SCN_LNK_NRELOC_OVFL] = "contains extended relocations";
    secHdrCharact[SCN_MEM_DISCARDABLE] = "discardable";
    secHdrCharact[SCN_MEM_NOT_CACHED] = "not cachable";
    secHdrCharact[SCN_MEM_NOT_PAGED] = "non-pageable";
    secHdrCharact[SCN_MEM_SHARED] = "shareable";
    secHdrCharact[SCN_CNT_CODE] = "code";
    secHdrCharact[SCN_CNT_INITIALIZED_DATA] = "initialized data";
    secHdrCharact[SCN_CNT_UNINITIALIZED_DATA] = "uninitialized data";
}